

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexParser.cpp
# Opt level: O1

Node * __thiscall
UnifiedRegex::Parser<NullTerminatedUnicodeEncodingPolicy,_true>::CharacterClassPass1<true>
          (Parser<NullTerminatedUnicodeEncodingPolicy,_true> *this)

{
  undefined1 *puVar1;
  uint32 *this_00;
  EncodedChar EVar2;
  SurrogatePairTracker *pSVar3;
  EncodedChar *pEVar4;
  long lVar5;
  code *pcVar6;
  CharBitvec *this_01;
  undefined2 uVar7;
  Parser<NullTerminatedUnicodeEncodingPolicy,_true> *pPVar8;
  bool bVar9;
  uint uVar10;
  int iVar11;
  codepoint_t codePointValue;
  uint uVar12;
  uint uVar13;
  undefined4 *puVar14;
  long *plVar15;
  Node *pNVar16;
  ulong uVar17;
  undefined4 extraout_var;
  Node *pNVar18;
  AltNode *pAVar19;
  AltNode *pAVar20;
  Char CVar21;
  Char CVar22;
  ArenaAllocator *pAVar24;
  uint32 *puVar25;
  byte bVar26;
  uint totalCount_3;
  uint uVar27;
  uint totalCount_2;
  uint uVar28;
  long lVar29;
  uint totalCount_1;
  int iVar30;
  uint totalCount;
  NodeTag *pNVar31;
  AltNode *lastAltNode;
  char16 local_920 [4];
  CharSet<unsigned_int> negatedSet;
  codepoint_t lowerCharOfRange;
  undefined1 local_3d0 [8];
  MatchSetNode deferredSetNode;
  CharSet<unsigned_int> codePointSet;
  Char local_5c;
  int iStack_58;
  codepoint_t upperCharOfRange;
  uint32 *local_50;
  bool local_41;
  Char local_40;
  EncodedChar EStack_3a;
  bool previousWasASurrogate;
  Parser<NullTerminatedUnicodeEncodingPolicy,_true> *local_38;
  ulong uVar23;
  
  local_38 = this;
  if (this->unicodeFlagPresent == false) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar14 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar14 = 1;
    bVar9 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                       ,0x842,"(containsSurrogates ? unicodeFlagPresent : true)",
                       "containsSurrogates ? unicodeFlagPresent : true");
    if (!bVar9) goto LAB_00ecfce5;
    *puVar14 = 0;
  }
  local_50 = deferredSetNode.set.rep.full.direct.vec + 6;
  CharSet<unsigned_int>::CharSet((CharSet<unsigned_int> *)local_50);
  deferredSetNode.super_Node._vptr_Node._0_4_ = 0xb;
  deferredSetNode.super_Node._vptr_Node._4_4_ =
       deferredSetNode.super_Node._vptr_Node._4_4_ & 0xffff8000;
  deferredSetNode.super_Node.tag = Empty;
  deferredSetNode.super_Node.features = 0;
  deferredSetNode.super_Node._12_4_ = 0;
  deferredSetNode.super_Node.firstSet = (CharSet<char16_t> *)0x0;
  deferredSetNode.super_Node.followSet._0_4_ = 0;
  deferredSetNode.super_Node._28_8_ = 0xffffffff;
  deferredSetNode.super_Node.prevConsumes.upper = 0xffffffff;
  deferredSetNode.super_Node.thisConsumes.lower = 0;
  deferredSetNode.super_Node.thisConsumes.upper = 0xffffffff;
  local_3d0 = (undefined1  [8])&PTR_LiteralLength_01558fd0;
  deferredSetNode.super_Node.followConsumes.lower._0_2_ = 0x100;
  CharSet<char16_t>::CharSet((CharSet<char16_t> *)&deferredSetNode.isNegation);
  codePointSet.characterPlanes[0x10].rep._32_8_ = &PTR_LiteralLength_01558ef0;
  if (local_38->inputLim < local_38->next) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar14 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar14 = 1;
    bVar9 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                       ,0xc4,"(next + n <= inputLim)","next + n <= inputLim");
    if (!bVar9) goto LAB_00ecfce5;
    *puVar14 = 0;
  }
  EStack_3a = *local_38->next;
  if (EStack_3a == L'^') {
    if (local_38->inputLim < local_38->next + 1) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar14 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar14 = 1;
      bVar9 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                         ,0xd3,"(next + n <= inputLim)","next + n <= inputLim");
      if (!bVar9) goto LAB_00ecfce5;
      *puVar14 = 0;
    }
    local_38->next = local_38->next + 1;
  }
  if (local_38->inputLim < local_38->next) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar14 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar14 = 1;
    bVar9 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                       ,0xc4,"(next + n <= inputLim)","next + n <= inputLim");
    if (!bVar9) goto LAB_00ecfce5;
    *puVar14 = 0;
  }
  EVar2 = *local_38->next;
  local_41 = false;
  uVar23 = 0xffffffff;
  CVar21 = 0xffffffff;
  if (EVar2 == L']') {
LAB_00ece7c6:
    if (CVar21 != 0xffffffff) {
      CharSet<unsigned_int>::SetRange
                ((CharSet<unsigned_int> *)(deferredSetNode.set.rep.full.direct.vec + 6),
                 local_38->ctAllocator,CVar21,CVar21);
    }
    if (local_38->unicodeFlagPresent == false) {
      if (deferredSetNode.set.rep._32_8_ - 1 < 5) {
        _iStack_58 = (undefined4 *)(ulong)((int)deferredSetNode.set.rep._32_8_ - 1);
      }
      else if (deferredSetNode.set.rep._32_8_ == 0) {
        uVar10 = CharBitvec::Count((CharBitvec *)&codePointSet);
        _iStack_58 = (undefined4 *)CONCAT44(extraout_var,uVar10);
      }
      else {
        if (((undefined8 *)deferredSetNode.set.rep._32_8_ != &CharSetFull::Instance) &&
           (uVar28 = (**(code **)(*(long *)deferredSetNode.set.rep._32_8_ + 0x58))
                               (deferredSetNode.set.rep._32_8_,2), 0xff00 < uVar28)) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar14 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar14 = 1;
          bVar9 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/CharSet.h"
                             ,0x252,
                             "(rep.full.root == CharSetFull::TheFullNode || rep.full.root->Count(CharSetNode::levels - 1) <= 0xFF00)"
                             ,
                             "rep.full.root == CharSetFull::TheFullNode || rep.full.root->Count(CharSetNode::levels - 1) <= 0xFF00"
                            );
          if (!bVar9) goto LAB_00ecfce5;
          *puVar14 = 0;
        }
        uVar10 = CharBitvec::Count((CharBitvec *)&codePointSet);
        if ((undefined8 *)deferredSetNode.set.rep._32_8_ == &CharSetFull::Instance) {
          iVar30 = 0xff00;
        }
        else {
          iVar30 = (**(code **)(*(long *)deferredSetNode.set.rep._32_8_ + 0x58))
                             (deferredSetNode.set.rep._32_8_,2);
        }
        _iStack_58 = (undefined4 *)(ulong)(iVar30 + uVar10);
      }
      puVar14 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      lVar29 = 0;
      iVar30 = 0;
      do {
        lVar5 = *(long *)((long)codePointSet.characterPlanes + lVar29 + -8);
        if (lVar5 - 1U < 5) {
          uVar10 = (int)lVar5 - 1;
        }
        else {
          plVar15 = *(long **)((long)codePointSet.characterPlanes + lVar29 + -8);
          if (plVar15 == (long *)0x0) {
            uVar10 = CharBitvec::Count((CharBitvec *)
                                       ((long)&codePointSet.characterPlanes[0].rep + lVar29));
          }
          else {
            if ((plVar15 != &CharSetFull::Instance) &&
               (uVar28 = (**(code **)(*plVar15 + 0x58))(plVar15,2), 0xff00 < uVar28)) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              *puVar14 = 1;
              bVar9 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/CharSet.h"
                                 ,0x252,
                                 "(rep.full.root == CharSetFull::TheFullNode || rep.full.root->Count(CharSetNode::levels - 1) <= 0xFF00)"
                                 ,
                                 "rep.full.root == CharSetFull::TheFullNode || rep.full.root->Count(CharSetNode::levels - 1) <= 0xFF00"
                                );
              if (!bVar9) goto LAB_00ecfce5;
              *puVar14 = 0;
            }
            uVar10 = CharBitvec::Count((CharBitvec *)
                                       ((long)&codePointSet.characterPlanes[0].rep + lVar29));
            plVar15 = *(long **)((long)codePointSet.characterPlanes + lVar29 + -8);
            if (plVar15 == &CharSetFull::Instance) {
              iVar11 = 0xff00;
            }
            else {
              iVar11 = (**(code **)(*plVar15 + 0x58))(plVar15,2);
            }
            uVar10 = iVar11 + uVar10;
          }
        }
        iVar30 = iVar30 + uVar10;
        lVar29 = lVar29 + 0x28;
      } while (lVar29 != 0x2a8);
      if (iStack_58 != iVar30) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar14 = 1;
        bVar9 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                           ,0x8e2,"(codePointSet.SimpleCharCount() == codePointSet.Count())",
                           "codePointSet.SimpleCharCount() == codePointSet.Count()");
        if (!bVar9) goto LAB_00ecfce5;
        *puVar14 = 0;
      }
      pPVar8 = local_38;
      pNVar16 = (Node *)new<Memory::ArenaAllocator>(0x68,local_38->ctAllocator,0x366bee);
      *(uint *)&pNVar16->field_0xc = *(uint *)&pNVar16->field_0xc & 0xffff8000;
      pNVar16->tag = MatchSet;
      pNVar16->features = 0;
      pNVar16->firstSet = (CharSet<char16_t> *)0x0;
      pNVar16->followSet = (CharSet<char16_t> *)0x0;
      (pNVar16->prevConsumes).lower = 0;
      *(undefined8 *)&(pNVar16->prevConsumes).upper = 0xffffffff;
      *(undefined8 *)&(pNVar16->thisConsumes).upper = 0xffffffff;
      (pNVar16->followConsumes).upper = 0xffffffff;
      pNVar16->_vptr_Node = (_func_int **)&PTR_LiteralLength_01558fd0;
      *(bool *)&pNVar16[1]._vptr_Node = EStack_3a == L'^';
      *(undefined1 *)((long)&pNVar16[1]._vptr_Node + 1) = 1;
      pNVar31 = &pNVar16[1].tag;
      CharSet<char16_t>::CharSet((CharSet<char16_t> *)pNVar31);
      pAVar24 = pPVar8->ctAllocator;
      puVar25 = deferredSetNode.set.rep.full.direct.vec + 6;
    }
    else {
      if (((local_38->scriptContext->config).threadConfig)->m_ES6Unicode == false) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar14 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar14 = 1;
        bVar9 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                           ,0x8e9,"(scriptContext->GetConfig()->IsES6UnicodeExtensionsEnabled())",
                           "scriptContext->GetConfig()->IsES6UnicodeExtensionsEnabled()");
        if (!bVar9) goto LAB_00ecfce5;
        *puVar14 = 0;
      }
      if (deferredSetNode.set.rep._32_8_ == 1) {
        plVar15 = (long *)((long)&codePointSet.characterPlanes[0].rep + 0x20);
        uVar23 = 0;
        do {
          uVar17 = uVar23;
          if (uVar17 == 0x10) break;
          lVar29 = *plVar15;
          plVar15 = plVar15 + 5;
          uVar23 = uVar17 + 1;
        } while (lVar29 == 1);
        if (0xf < uVar17) {
          pNVar16 = (Node *)new<Memory::ArenaAllocator>(0x68,local_38->ctAllocator,0x366bee);
          pNVar16->tag = MatchSet;
          pNVar16->features = 0;
          *(uint *)&pNVar16->field_0xc = *(uint *)&pNVar16->field_0xc & 0xffff8000;
          pNVar16->firstSet = (CharSet<char16_t> *)0x0;
          pNVar16->followSet = (CharSet<char16_t> *)0x0;
          (pNVar16->prevConsumes).lower = 0;
          *(undefined8 *)&(pNVar16->prevConsumes).upper = 0xffffffff;
          *(undefined8 *)&(pNVar16->thisConsumes).upper = 0xffffffff;
          (pNVar16->followConsumes).upper = 0xffffffff;
          pNVar16->_vptr_Node = (_func_int **)&PTR_LiteralLength_01558fd0;
          *(undefined2 *)&pNVar16[1]._vptr_Node = 0x100;
          CharSet<char16_t>::CharSet((CharSet<char16_t> *)&pNVar16[1].tag);
          return pNVar16;
        }
      }
      if ((EStack_3a != L'^') && (local_38->caseInsensitiveFlagPresent == false)) {
        puVar14 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        lVar29 = 0;
        iVar30 = 0;
        do {
          lVar5 = *(long *)((long)codePointSet.characterPlanes + lVar29 + -8);
          if (lVar5 - 1U < 5) {
            uVar10 = (int)lVar5 - 1;
          }
          else {
            plVar15 = *(long **)((long)codePointSet.characterPlanes + lVar29 + -8);
            if (plVar15 == (long *)0x0) {
              uVar10 = CharBitvec::Count((CharBitvec *)
                                         ((long)&codePointSet.characterPlanes[0].rep + lVar29));
            }
            else {
              if ((plVar15 != &CharSetFull::Instance) &&
                 (uVar28 = (**(code **)(*plVar15 + 0x58))(plVar15,2), 0xff00 < uVar28)) {
                AssertCount = AssertCount + 1;
                Js::Throw::LogAssert();
                *puVar14 = 1;
                bVar9 = Js::Throw::ReportAssert
                                  ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/CharSet.h"
                                   ,0x252,
                                   "(rep.full.root == CharSetFull::TheFullNode || rep.full.root->Count(CharSetNode::levels - 1) <= 0xFF00)"
                                   ,
                                   "rep.full.root == CharSetFull::TheFullNode || rep.full.root->Count(CharSetNode::levels - 1) <= 0xFF00"
                                  );
                if (!bVar9) goto LAB_00ecfce5;
                *puVar14 = 0;
              }
              uVar10 = CharBitvec::Count((CharBitvec *)
                                         ((long)&codePointSet.characterPlanes[0].rep + lVar29));
              plVar15 = *(long **)((long)codePointSet.characterPlanes + lVar29 + -8);
              if (plVar15 == &CharSetFull::Instance) {
                iVar11 = 0xff00;
              }
              else {
                iVar11 = (**(code **)(*plVar15 + 0x58))(plVar15,2);
              }
              uVar10 = iVar11 + uVar10;
            }
          }
          iVar30 = iVar30 + uVar10;
          lVar29 = lVar29 + 0x28;
        } while (lVar29 != 0x2a8);
        if (iVar30 == 1) {
          codePointValue =
               CharSet<unsigned_int>::Singleton
                         ((CharSet<unsigned_int> *)(deferredSetNode.set.rep.full.direct.vec + 6));
          if (codePointValue < 0x10000) {
            pNVar16 = (Node *)new<Memory::ArenaAllocator>(0x48,local_38->ctAllocator,0x366bee);
            pNVar16->tag = MatchChar;
            pNVar16->features = 0;
            *(uint *)&pNVar16->field_0xc = *(uint *)&pNVar16->field_0xc & 0xffff8000;
            pNVar16->firstSet = (CharSet<char16_t> *)0x0;
            pNVar16->followSet = (CharSet<char16_t> *)0x0;
            (pNVar16->prevConsumes).lower = 0;
            *(undefined8 *)&(pNVar16->prevConsumes).upper = 0xffffffff;
            *(undefined8 *)&(pNVar16->thisConsumes).upper = 0xffffffff;
            (pNVar16->followConsumes).upper = 0xffffffff;
            pNVar16->_vptr_Node = (_func_int **)&PTR_LiteralLength_01558ef0;
            *(undefined1 *)&pNVar16[1].tag = Empty;
            *(short *)&pNVar16[1]._vptr_Node = (short)codePointValue;
            lVar29 = 0x1d;
            do {
              *(short *)((long)&pNVar16->_vptr_Node + lVar29 * 2) = (short)codePointValue;
              lVar29 = lVar29 + 1;
            } while (lVar29 != 0x20);
          }
          else {
            if (local_38->unicodeFlagPresent == false) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              *puVar14 = 1;
              bVar9 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                                 ,0x902,"(unicodeFlagPresent)","unicodeFlagPresent");
              if (!bVar9) goto LAB_00ecfce5;
              *puVar14 = 0;
            }
            Js::NumberUtilities::CodePointAsSurrogatePair
                      (codePointValue,local_920,
                       (char16 *)(negatedSet.characterPlanes[0x10].rep.compact.padding + 8));
            pNVar16 = CreateSurrogatePairAtom
                                (local_38,local_920[0],
                                 negatedSet.characterPlanes[0x10].rep.full.direct.vec[6]._0_2_);
          }
          CharSet<unsigned_int>::Clear
                    ((CharSet<unsigned_int> *)(deferredSetNode.set.rep.full.direct.vec + 6),
                     local_38->ctAllocator);
          return pNVar16;
        }
      }
      CharSet<unsigned_int>::CharSet((CharSet<unsigned_int> *)local_920);
      if (local_38->caseInsensitiveFlagPresent == false) {
        if (EStack_3a == L'^') {
          CharSet<unsigned_int>::ToComplement
                    ((CharSet<unsigned_int> *)(deferredSetNode.set.rep.full.direct.vec + 6),
                     local_38->ctAllocator,(CharSet<unsigned_int> *)local_920);
          local_50 = (uint32 *)local_920;
        }
        puVar25 = local_50;
        if (EStack_3a == L'^') {
          CharSet<unsigned_int>::FreeBody
                    ((CharSet<unsigned_int> *)(deferredSetNode.set.rep.full.direct.vec + 6),
                     local_38->ctAllocator);
          puVar25 = local_50;
        }
      }
      else {
        puVar25 = negatedSet.characterPlanes[0x10].rep.full.direct.vec + 6;
        CharSet<unsigned_int>::CharSet((CharSet<unsigned_int> *)puVar25);
        CharSet<unsigned_int>::ToEquivClass
                  ((CharSet<unsigned_int> *)(deferredSetNode.set.rep.full.direct.vec + 6),
                   local_38->ctAllocator,(CharSet<unsigned_int> *)puVar25);
        puVar14 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        lVar29 = 0;
        uVar28 = 0;
        do {
          lVar5 = *(long *)((long)&negatedSet.characterPlanes[0x10].rep + lVar29 + 0x20);
          if (lVar5 - 1U < 5) {
            uVar10 = (int)lVar5 - 1;
          }
          else {
            plVar15 = *(long **)((long)&negatedSet.characterPlanes[0x10].rep + lVar29 + 0x20);
            if (plVar15 == (long *)0x0) {
              uVar10 = CharBitvec::Count((CharBitvec *)((long)&lowerCharOfRange + lVar29));
            }
            else {
              if ((plVar15 != &CharSetFull::Instance) &&
                 (uVar27 = (**(code **)(*plVar15 + 0x58))(plVar15,2), 0xff00 < uVar27)) {
                AssertCount = AssertCount + 1;
                Js::Throw::LogAssert();
                *puVar14 = 1;
                bVar9 = Js::Throw::ReportAssert
                                  ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/CharSet.h"
                                   ,0x252,
                                   "(rep.full.root == CharSetFull::TheFullNode || rep.full.root->Count(CharSetNode::levels - 1) <= 0xFF00)"
                                   ,
                                   "rep.full.root == CharSetFull::TheFullNode || rep.full.root->Count(CharSetNode::levels - 1) <= 0xFF00"
                                  );
                if (!bVar9) goto LAB_00ecfce5;
                *puVar14 = 0;
              }
              uVar10 = CharBitvec::Count((CharBitvec *)((long)&lowerCharOfRange + lVar29));
              plVar15 = *(long **)((long)&negatedSet.characterPlanes[0x10].rep + lVar29 + 0x20);
              if (plVar15 == &CharSetFull::Instance) {
                iVar30 = 0xff00;
              }
              else {
                iVar30 = (**(code **)(*plVar15 + 0x58))(plVar15,2);
              }
              uVar10 = iVar30 + uVar10;
            }
          }
          uVar28 = uVar28 + uVar10;
          lVar29 = lVar29 + 0x28;
        } while (lVar29 != 0x2a8);
        _iStack_58 = puVar14;
        lVar29 = 0;
        uVar27 = 0;
        do {
          lVar5 = *(long *)((long)codePointSet.characterPlanes + lVar29 + -8);
          if (lVar5 - 1U < 5) {
            uVar10 = (int)lVar5 - 1;
          }
          else {
            plVar15 = *(long **)((long)codePointSet.characterPlanes + lVar29 + -8);
            if (plVar15 == (long *)0x0) {
              uVar10 = CharBitvec::Count((CharBitvec *)
                                         ((long)&codePointSet.characterPlanes[0].rep + lVar29));
            }
            else {
              if ((plVar15 != &CharSetFull::Instance) &&
                 (uVar12 = (**(code **)(*plVar15 + 0x58))(plVar15,2), 0xff00 < uVar12)) {
                AssertCount = AssertCount + 1;
                Js::Throw::LogAssert();
                puVar14 = _iStack_58;
                *_iStack_58 = 1;
                bVar9 = Js::Throw::ReportAssert
                                  ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/CharSet.h"
                                   ,0x252,
                                   "(rep.full.root == CharSetFull::TheFullNode || rep.full.root->Count(CharSetNode::levels - 1) <= 0xFF00)"
                                   ,
                                   "rep.full.root == CharSetFull::TheFullNode || rep.full.root->Count(CharSetNode::levels - 1) <= 0xFF00"
                                  );
                if (!bVar9) goto LAB_00ecfce5;
                *puVar14 = 0;
              }
              uVar10 = CharBitvec::Count((CharBitvec *)
                                         ((long)&codePointSet.characterPlanes[0].rep + lVar29));
              plVar15 = *(long **)((long)codePointSet.characterPlanes + lVar29 + -8);
              if (plVar15 == &CharSetFull::Instance) {
                iVar30 = 0xff00;
              }
              else {
                iVar30 = (**(code **)(*plVar15 + 0x58))(plVar15,2);
              }
              uVar10 = iVar30 + uVar10;
            }
          }
          uVar27 = uVar27 + uVar10;
          lVar29 = lVar29 + 0x28;
        } while (lVar29 != 0x2a8);
        if (uVar28 < uVar27) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar14 = _iStack_58;
          *_iStack_58 = 1;
          bVar9 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                             ,0x925,"(caseEquivalent.Count() >= codePointSet.Count())",
                             "caseEquivalent.Count() >= codePointSet.Count()");
          if (!bVar9) goto LAB_00ecfce5;
          *puVar14 = 0;
        }
        if (EStack_3a == L'^') {
          puVar25 = deferredSetNode.set.rep.full.direct.vec + 6;
          CharSet<unsigned_int>::Clear((CharSet<unsigned_int> *)puVar25,local_38->ctAllocator);
          pPVar8 = local_38;
          this_00 = negatedSet.characterPlanes[0x10].rep.full.direct.vec + 6;
          CharSet<unsigned_int>::ToComplement
                    ((CharSet<unsigned_int> *)this_00,local_38->ctAllocator,
                     (CharSet<unsigned_int> *)puVar25);
          CharSet<unsigned_int>::FreeBody((CharSet<unsigned_int> *)this_00,pPVar8->ctAllocator);
        }
        else {
          CharSet<unsigned_int>::CloneFrom
                    ((CharSet<unsigned_int> *)(deferredSetNode.set.rep.full.direct.vec + 6),
                     local_38->ctAllocator,
                     (CharSet<unsigned_int> *)
                     (negatedSet.characterPlanes[0x10].rep.full.direct.vec + 6));
          puVar25 = deferredSetNode.set.rep.full.direct.vec + 6;
        }
      }
      _iStack_58 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      this_01 = (CharBitvec *)(puVar25 + 2);
      lVar29 = 0;
      uVar10 = 0;
      local_50 = puVar25;
      do {
        if (*(long *)((long)puVar25 + lVar29) - 1U < 5) {
          uVar13 = (int)*(long *)((long)puVar25 + lVar29) - 1;
        }
        else {
          plVar15 = *(long **)((long)puVar25 + lVar29);
          if (plVar15 == (long *)0x0) {
            uVar13 = CharBitvec::Count((CharBitvec *)((long)this_01->vec + lVar29));
          }
          else {
            if ((plVar15 != &CharSetFull::Instance) &&
               (uVar28 = (**(code **)(*plVar15 + 0x58))(plVar15,2), 0xff00 < uVar28)) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              puVar14 = _iStack_58;
              *_iStack_58 = 1;
              bVar9 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/CharSet.h"
                                 ,0x252,
                                 "(rep.full.root == CharSetFull::TheFullNode || rep.full.root->Count(CharSetNode::levels - 1) <= 0xFF00)"
                                 ,
                                 "rep.full.root == CharSetFull::TheFullNode || rep.full.root->Count(CharSetNode::levels - 1) <= 0xFF00"
                                );
              if (!bVar9) goto LAB_00ecfce5;
              *puVar14 = 0;
            }
            uVar13 = CharBitvec::Count((CharBitvec *)((long)this_01->vec + lVar29));
            plVar15 = *(long **)((long)local_50 + lVar29);
            if (plVar15 == &CharSetFull::Instance) {
              iVar30 = 0xff00;
            }
            else {
              iVar30 = (**(code **)(*plVar15 + 0x58))(plVar15,2);
            }
            uVar13 = iVar30 + uVar13;
            puVar25 = local_50;
          }
        }
        uVar10 = uVar10 + uVar13;
        lVar29 = lVar29 + 0x28;
      } while (lVar29 != 0x2a8);
      if (*(long *)puVar25 - 1U < 5) {
        uVar13 = (int)*(long *)puVar25 - 1;
      }
      else {
        plVar15 = *(long **)puVar25;
        if (plVar15 == (long *)0x0) {
          uVar13 = CharBitvec::Count(this_01);
        }
        else {
          if ((plVar15 != &CharSetFull::Instance) &&
             (uVar28 = (**(code **)(*plVar15 + 0x58))(plVar15,2), 0xff00 < uVar28)) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar14 = _iStack_58;
            *_iStack_58 = 1;
            bVar9 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/CharSet.h"
                               ,0x252,
                               "(rep.full.root == CharSetFull::TheFullNode || rep.full.root->Count(CharSetNode::levels - 1) <= 0xFF00)"
                               ,
                               "rep.full.root == CharSetFull::TheFullNode || rep.full.root->Count(CharSetNode::levels - 1) <= 0xFF00"
                              );
            if (!bVar9) goto LAB_00ecfce5;
            *puVar14 = 0;
          }
          uVar13 = CharBitvec::Count(this_01);
          plVar15 = *(long **)local_50;
          if (plVar15 == &CharSetFull::Instance) {
            iVar30 = 0xff00;
          }
          else {
            iVar30 = (**(code **)(*plVar15 + 0x58))(plVar15,2);
          }
          uVar13 = iVar30 + uVar13;
          puVar25 = local_50;
        }
      }
      pPVar8 = local_38;
      if (uVar10 != uVar13) {
        if (uVar13 == 0) {
          pNVar18 = (Node *)0x0;
          pNVar16 = (Node *)0x0;
        }
        else {
          negatedSet.characterPlanes[0x10].rep.full.direct.vec[6]._0_2_ = 0xffff;
          local_5c = local_5c & 0xffff0000;
          bVar9 = CharSet<char16_t>::GetNextRange
                            ((CharSet<char16_t> *)local_50,L'\xd800',
                             (Char *)(negatedSet.characterPlanes[0x10].rep.compact.padding + 8),
                             (Char *)&local_5c);
          pPVar8 = local_38;
          uVar7 = negatedSet.characterPlanes[0x10].rep.full.direct.vec[6]._0_2_;
          pNVar16 = (Node *)new<Memory::ArenaAllocator>(0x68,local_38->ctAllocator,0x366bee);
          pNVar16->tag = MatchSet;
          pNVar16->features = 0;
          *(uint *)&pNVar16->field_0xc = *(uint *)&pNVar16->field_0xc & 0xffff8000;
          pNVar16->firstSet = (CharSet<char16_t> *)0x0;
          pNVar16->followSet = (CharSet<char16_t> *)0x0;
          (pNVar16->prevConsumes).lower = 0;
          *(undefined8 *)&(pNVar16->prevConsumes).upper = 0xffffffff;
          *(undefined8 *)&(pNVar16->thisConsumes).upper = 0xffffffff;
          (pNVar16->followConsumes).upper = 0xffffffff;
          pNVar16->_vptr_Node = (_func_int **)&PTR_LiteralLength_01558fd0;
          *(undefined2 *)&pNVar16[1]._vptr_Node = 0x100;
          pNVar31 = &pNVar16[1].tag;
          CharSet<char16_t>::CharSet((CharSet<char16_t> *)pNVar31);
          puVar25 = local_50;
          if ((bVar9) && ((ushort)uVar7 < 0xe000)) {
            CharSet<unsigned_int>::CloneNonSurrogateCodeUnitsTo
                      ((CharSet<unsigned_int> *)local_50,pPVar8->ctAllocator,
                       (CharSet<char16_t> *)pNVar31);
            pPVar8 = local_38;
            pNVar18 = (Node *)new<Memory::ArenaAllocator>(0x68,local_38->ctAllocator,0x366bee);
            pNVar18->tag = MatchSet;
            pNVar18->features = 0;
            *(uint *)&pNVar18->field_0xc = *(uint *)&pNVar18->field_0xc & 0xffff8000;
            pNVar18->firstSet = (CharSet<char16_t> *)0x0;
            pNVar18->followSet = (CharSet<char16_t> *)0x0;
            (pNVar18->prevConsumes).lower = 0;
            *(undefined8 *)&(pNVar18->prevConsumes).upper = 0xffffffff;
            *(undefined8 *)&(pNVar18->thisConsumes).upper = 0xffffffff;
            (pNVar18->followConsumes).upper = 0xffffffff;
            pNVar18->_vptr_Node = (_func_int **)&PTR_LiteralLength_01558fd0;
            *(undefined2 *)&pNVar18[1]._vptr_Node = 0x100;
            CharSet<char16_t>::CharSet((CharSet<char16_t> *)&pNVar18[1].tag);
            CharSet<unsigned_int>::CloneSurrogateCodeUnitsTo
                      ((CharSet<unsigned_int> *)puVar25,pPVar8->ctAllocator,
                       (CharSet<char16_t> *)&pNVar18[1].tag);
          }
          else {
            CharSet<unsigned_int>::CloneSimpleCharsTo
                      ((CharSet<unsigned_int> *)local_50,pPVar8->ctAllocator,
                       (CharSet<char16_t> *)pNVar31);
            pNVar18 = (Node *)0x0;
          }
        }
        if (local_38->unicodeFlagPresent == false) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar14 = _iStack_58;
          *_iStack_58 = 1;
          bVar9 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                             ,0x954,"(unicodeFlagPresent)","unicodeFlagPresent");
          if (!bVar9) {
LAB_00ecfce5:
            pcVar6 = (code *)invalidInstructionException();
            (*pcVar6)();
          }
          *puVar14 = 0;
        }
        if (pNVar16 == (Node *)0x0) {
          pAVar19 = (AltNode *)0x0;
        }
        else {
          pAVar19 = (AltNode *)new<Memory::ArenaAllocator>(0x60,local_38->ctAllocator,0x366bee);
          (pAVar19->super_Node).tag = Alt;
          (pAVar19->super_Node).features = 0;
          puVar1 = &(pAVar19->super_Node).field_0xc;
          *(uint *)puVar1 = *(uint *)puVar1 & 0xffff8000;
          (pAVar19->super_Node).firstSet = (CharSet<char16_t> *)0x0;
          (pAVar19->super_Node).followSet = (CharSet<char16_t> *)0x0;
          (pAVar19->super_Node).prevConsumes.lower = 0;
          *(undefined8 *)&(pAVar19->super_Node).prevConsumes.upper = 0xffffffff;
          *(undefined8 *)&(pAVar19->super_Node).thisConsumes.upper = 0xffffffff;
          (pAVar19->super_Node).followConsumes.upper = 0xffffffff;
          (pAVar19->super_Node)._vptr_Node = (_func_int **)&PTR_LiteralLength_01559190;
          pAVar19->head = pNVar16;
          pAVar19->switchSize = 0;
          pAVar19->tail = (AltNode *)0x0;
          pAVar19->runtimeTrie = (RuntimeCharTrie *)0x0;
          *(undefined8 *)((long)&pAVar19->runtimeTrie + 5) = 0;
        }
        negatedSet.characterPlanes[0x10].rep.full.direct.vec[6] = 0;
        local_5c = 0;
        bVar9 = CharSet<unsigned_int>::GetNextRange
                          ((CharSet<unsigned_int> *)local_50,0x10000,
                           (Char *)(negatedSet.characterPlanes[0x10].rep.compact.padding + 8),
                           &local_5c);
        lastAltNode = pAVar19;
        if (bVar9) {
          do {
            if (negatedSet.characterPlanes[0x10].rep.full.direct.vec[6] == local_5c) {
              pAVar20 = AppendSurrogatePairToDisjunction
                                  (local_38,negatedSet.characterPlanes[0x10].rep.full.direct.vec[6],
                                   lastAltNode);
            }
            else {
              pAVar20 = AppendSurrogateRangeToDisjunction
                                  (local_38,negatedSet.characterPlanes[0x10].rep.full.direct.vec[6],
                                   local_5c,lastAltNode);
            }
            if (pAVar19 == (AltNode *)0x0) {
              pAVar19 = pAVar20;
            }
            if (pAVar20 == (AltNode *)0x0) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              puVar14 = _iStack_58;
              *_iStack_58 = 1;
              bVar9 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                                 ,0x96a,"(currentTail != nullptr)","currentTail != nullptr");
              if (!bVar9) goto LAB_00ecfce5;
              *puVar14 = 0;
            }
            do {
              lastAltNode = pAVar20;
              pAVar20 = lastAltNode->tail;
            } while (lastAltNode->tail != (AltNode *)0x0);
            bVar9 = CharSet<unsigned_int>::GetNextRange
                              ((CharSet<unsigned_int> *)local_50,local_5c + 1,
                               (Char *)(negatedSet.characterPlanes[0x10].rep.compact.padding + 8),
                               &local_5c);
          } while (bVar9);
        }
        if (pNVar18 != (Node *)0x0) {
          pAVar20 = (AltNode *)new<Memory::ArenaAllocator>(0x60,local_38->ctAllocator,0x366bee);
          (pAVar20->super_Node).tag = Alt;
          (pAVar20->super_Node).features = 0;
          puVar1 = &(pAVar20->super_Node).field_0xc;
          *(uint *)puVar1 = *(uint *)puVar1 & 0xffff8000;
          (pAVar20->super_Node).firstSet = (CharSet<char16_t> *)0x0;
          (pAVar20->super_Node).followSet = (CharSet<char16_t> *)0x0;
          (pAVar20->super_Node).prevConsumes.lower = 0;
          *(undefined8 *)&(pAVar20->super_Node).prevConsumes.upper = 0xffffffff;
          *(undefined8 *)&(pAVar20->super_Node).thisConsumes.upper = 0xffffffff;
          (pAVar20->super_Node).followConsumes.upper = 0xffffffff;
          (pAVar20->super_Node)._vptr_Node = (_func_int **)&PTR_LiteralLength_01559190;
          pAVar20->head = pNVar18;
          pAVar20->switchSize = 0;
          pAVar20->tail = (AltNode *)0x0;
          pAVar20->runtimeTrie = (RuntimeCharTrie *)0x0;
          *(undefined8 *)((long)&pAVar20->runtimeTrie + 5) = 0;
          lastAltNode->tail = pAVar20;
        }
        CharSet<unsigned_int>::Clear((CharSet<unsigned_int> *)local_50,local_38->ctAllocator);
        if (pAVar19 == (AltNode *)0x0) {
          return (Node *)0x0;
        }
        if (pAVar19->tail != (AltNode *)0x0) {
          return &pAVar19->super_Node;
        }
        return pAVar19->head;
      }
      pNVar16 = (Node *)new<Memory::ArenaAllocator>(0x68,local_38->ctAllocator,0x366bee);
      *(uint *)&pNVar16->field_0xc = *(uint *)&pNVar16->field_0xc & 0xffff8000;
      pNVar16->tag = MatchSet;
      pNVar16->features = 0;
      pNVar16->firstSet = (CharSet<char16_t> *)0x0;
      pNVar16->followSet = (CharSet<char16_t> *)0x0;
      (pNVar16->prevConsumes).lower = 0;
      *(undefined8 *)&(pNVar16->prevConsumes).upper = 0xffffffff;
      *(undefined8 *)&(pNVar16->thisConsumes).upper = 0xffffffff;
      (pNVar16->followConsumes).upper = 0xffffffff;
      pNVar16->_vptr_Node = (_func_int **)&PTR_LiteralLength_01558fd0;
      *(bool *)&pNVar16[1]._vptr_Node = EStack_3a == L'^';
      *(undefined1 *)((long)&pNVar16[1]._vptr_Node + 1) = 1;
      pNVar31 = &pNVar16[1].tag;
      CharSet<char16_t>::CharSet((CharSet<char16_t> *)pNVar31);
      pAVar24 = pPVar8->ctAllocator;
    }
    CharSet<unsigned_int>::CloneSimpleCharsTo
              ((CharSet<unsigned_int> *)puVar25,pAVar24,(CharSet<char16_t> *)pNVar31);
    return pNVar16;
  }
  puVar14 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
  bVar26 = 0;
  local_40 = 0xffffffff;
  uVar17 = 0;
LAB_00ece922:
  _iStack_58 = (undefined4 *)CONCAT71(stack0xffffffffffffffa9,bVar26);
  if (EVar2 == L'\\') {
    if (local_38->inputLim < local_38->next + 1) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar14 = 1;
      bVar9 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                         ,0xd3,"(next + n <= inputLim)","next + n <= inputLim");
      if (!bVar9) goto LAB_00ecfce5;
      *puVar14 = 0;
    }
    local_38->next = local_38->next + 1;
  }
  pSVar3 = local_38->currentSurrogatePairNode;
  CVar22 = (Char)uVar23;
  CVar21 = CVar22;
  if ((pSVar3 == (SurrogatePairTracker *)0x0) || (pSVar3->location != local_38->next)) {
    if (EVar2 == L'\\') {
      pNVar16 = ClassEscapePass1(local_38,(MatchCharNode *)
                                          (codePointSet.characterPlanes[0x10].rep.full.direct.vec +
                                          6),(MatchSetNode *)local_3d0,&local_41);
      if (pNVar16->tag != MatchSet) {
        uVar23 = 0;
        goto LAB_00ececb1;
      }
      puVar25 = deferredSetNode.set.rep.full.direct.vec + 6;
      if (local_40 != 0xffffffff) {
        if (local_38->unicodeFlagPresent == true) {
          Fail(local_38,-0x7ff5e9d3);
        }
        CharSet<unsigned_int>::SetRange
                  ((CharSet<unsigned_int> *)puVar25,local_38->ctAllocator,0x2d,0x2d);
      }
      CharSet<unsigned_int>::UnionInPlace
                ((CharSet<unsigned_int> *)puVar25,local_38->ctAllocator,
                 (CharSet<char16_t> *)&deferredSetNode.isNegation);
      local_40 = 0xffffffff;
      bVar26 = 1;
      uVar23 = 0xffffffff;
      goto LAB_00ececb6;
    }
    if (EVar2 == L'-') {
      if (CVar22 != 0xffffffff && local_40 == 0xffffffff) {
        if (local_38->inputLim < local_38->next + 1) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar14 = 1;
          bVar9 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                             ,0xc4,"(next + n <= inputLim)","next + n <= inputLim");
          if (!bVar9) goto LAB_00ecfce5;
          *puVar14 = 0;
        }
        if (local_38->next[1] != L']') {
          if (local_38->inputLim < local_38->next + 1) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *puVar14 = 1;
            bVar9 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                               ,0xd3,"(next + n <= inputLim)","next + n <= inputLim");
            if (!bVar9) goto LAB_00ecfce5;
            *puVar14 = 0;
          }
          local_38->next = local_38->next + 1;
          CVar21 = 0xffffffff;
          bVar26 = 0;
          local_40 = CVar22;
          goto LAB_00ececb6;
        }
      }
      if (local_38->inputLim < local_38->next + 1) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar14 = 1;
        bVar9 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                           ,0xd3,"(next + n <= inputLim)","next + n <= inputLim");
        if (!bVar9) goto LAB_00ecfce5;
        *puVar14 = 0;
      }
      local_38->next = local_38->next + 1;
      uVar23 = 0x2d;
      goto LAB_00ececb1;
    }
    if (local_38->inputLim <= local_38->next) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar14 = 1;
      bVar9 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                         ,0x25d,"(!IsEOF())","!IsEOF()");
      if (!bVar9) goto LAB_00ecfce5;
      *puVar14 = 0;
    }
    pEVar4 = local_38->next;
    local_38->next = pEVar4 + 1;
    EVar2 = *pEVar4;
    uVar23 = (ulong)(ushort)EVar2;
    if (uVar23 < 0x100) {
      bVar9 = (bool)((ASCIIChars::classes[uVar23] & 2) >> 1);
    }
    else {
      bVar9 = (EVar2 & 0xfffeU) == 0x2028;
    }
    if (bVar9 != false) {
      Fail(local_38,-0x7ff5fc0c);
    }
  }
  else {
    uVar23 = (ulong)pSVar3->value;
    if (local_38->inputLim < local_38->next + pSVar3->length) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar14 = 1;
      bVar9 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                         ,0x86b,"(ECCanConsume(this->currentSurrogatePairNode->length))",
                         "ECCanConsume(this->currentSurrogatePairNode->length)");
      if (!bVar9) goto LAB_00ecfce5;
      *puVar14 = 0;
    }
    uVar28 = local_38->currentSurrogatePairNode->length;
    if (local_38->inputLim < local_38->next + uVar28) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar14 = 1;
      bVar9 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                         ,0xde,"(next + n <= inputLim)","next + n <= inputLim");
      if (!bVar9) goto LAB_00ecfce5;
      *puVar14 = 0;
    }
    local_38->next = local_38->next + uVar28;
    local_38->currentSurrogatePairNode = local_38->currentSurrogatePairNode->next;
  }
LAB_00ececb1:
  bVar26 = 0;
LAB_00ececb6:
  CVar22 = (Char)uVar23;
  if ((~(byte)uVar17 & CVar21 == 0xffffffff) == 0) {
    if ((uVar17 & 1) == 0) {
      if (local_40 == 0xffffffff) {
        CharSet<unsigned_int>::SetRange
                  ((CharSet<unsigned_int> *)(deferredSetNode.set.rep.full.direct.vec + 6),
                   local_38->ctAllocator,CVar21,CVar21);
        local_40 = 0xffffffff;
        goto LAB_00ecedd8;
      }
      CVar21 = local_40;
      if (CVar22 < local_40) {
        if (local_38->unicodeFlagPresent == true) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar14 = 1;
          bVar9 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                             ,0x8bd,"(!unicodeFlagPresent)","!unicodeFlagPresent");
          if (!bVar9) goto LAB_00ecfce5;
          *puVar14 = 0;
        }
        CVar21 = local_40;
        Fail(local_38,-0x7ff5ec63);
      }
      pAVar24 = local_38->ctAllocator;
    }
    else {
      if (local_38->unicodeFlagPresent == true) {
        Fail(local_38,-0x7ff5e9d3);
      }
      if (CVar22 != 0xffffffff) {
        CharSet<unsigned_int>::SetRange
                  ((CharSet<unsigned_int> *)(deferredSetNode.set.rep.full.direct.vec + 6),
                   local_38->ctAllocator,CVar22,CVar22);
      }
      pAVar24 = local_38->ctAllocator;
      CVar21 = 0x2d;
      CVar22 = 0x2d;
    }
    CharSet<unsigned_int>::SetRange
              ((CharSet<unsigned_int> *)(deferredSetNode.set.rep.full.direct.vec + 6),pAVar24,CVar21
               ,CVar22);
    local_40 = 0xffffffff;
    uVar23 = 0xffffffff;
  }
LAB_00ecedd8:
  CVar21 = (Char)uVar23;
  if (local_38->inputLim < local_38->next) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    *puVar14 = 1;
    bVar9 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                       ,0xc4,"(next + n <= inputLim)","next + n <= inputLim");
    if (!bVar9) goto LAB_00ecfce5;
    *puVar14 = 0;
  }
  EVar2 = *local_38->next;
  bVar26 = bVar26 & EVar2 == L'-';
  uVar17 = (ulong)_iStack_58 & 0xff;
  if (EVar2 == L']') goto LAB_00ece7c6;
  goto LAB_00ece922;
}

Assistant:

Node* Parser<P, IsLiteral>::CharacterClassPass1()
    {
        Assert(containsSurrogates ? unicodeFlagPresent : true);

        CharSet<codepoint_t> codePointSet;

        MatchSetNode deferredSetNode(false, false);
        MatchCharNode deferredCharNode(0);

        bool isNegation = false;

        if (ECLookahead() == '^')
        {
            isNegation = true;
            ECConsume();
        }

        // We aren't expecting any terminating null characters, only embedded ones that should treated as valid characters.
        // CharacterClassPass0 should have taken care of terminating null.
        codepoint_t pendingCodePoint = INVALID_CODEPOINT;
        codepoint_t pendingRangeStart = INVALID_CODEPOINT;
        EncodedChar nextChar = ECLookahead();
        bool previousWasASurrogate = false;
        bool currIsACharSet = false;
        bool prevWasACharSetAndPartOfRange = false;
        bool prevprevWasACharSetAndPartOfRange = false;

        while(nextChar != ']')
        {
            codepoint_t codePointToSet = INVALID_CODEPOINT;

            // Consume ahead of time if we have two backslashes, both cases below (previously Tracked surrogate pair, and ClassEscapePass1) assume it is.
            if (nextChar == '\\')
            {
                ECConsume();
            }

            // These if-blocks are the logical ClassAtomPass1, they weren't grouped into a method to simplify dealing with multiple out parameters.
            if (containsSurrogates && this->currentSurrogatePairNode != nullptr && this->currentSurrogatePairNode->location == this->next)
            {
                codePointToSet = pendingCodePoint;

                pendingCodePoint = this->currentSurrogatePairNode->value;
                Assert(ECCanConsume(this->currentSurrogatePairNode->length));
                ECConsumeMultiUnit(this->currentSurrogatePairNode->length);
                this->RestoreMultiUnits(this->currentSurrogatePairNode->multiUnits);
                this->currentSurrogatePairNode = this->currentSurrogatePairNode->next;
            }
            else if (nextChar == '\\')
            {
                Node* returnedNode = ClassEscapePass1(&deferredCharNode, &deferredSetNode, previousWasASurrogate);
                codePointToSet = pendingCodePoint;

                if (returnedNode->tag == Node::MatchSet)
                {
                    if (pendingRangeStart != INVALID_CODEPOINT)
                    {
                        if (unicodeFlagPresent)
                        {
                            //A range containing a character class and the unicode flag is present, thus we end up having to throw a "Syntax" error here
                            //This breaks the notion of Pass0 check for valid syntax, because during that time, the unicode flag is unknown.
                            Fail(JSERR_UnicodeRegExpRangeContainsCharClass); //From #sec-patterns-static-semantics-early-errors-annexb
                        }

                        codePointSet.Set(ctAllocator, '-');
                    }

                    pendingCodePoint = INVALID_CODEPOINT;
                    pendingRangeStart = INVALID_CODEPOINT;
                    codePointSet.UnionInPlace(ctAllocator, deferredSetNode.set);
                    currIsACharSet = true;
                }
                else
                {
                    // Just a character
                    pendingCodePoint = deferredCharNode.cs[0];
                }
            }
            else if (nextChar == '-')
            {
                if (pendingRangeStart != INVALID_CODEPOINT || pendingCodePoint == INVALID_CODEPOINT || ECLookahead(1) == ']')
                {
                    // - is just a char, or end of a range.
                    codePointToSet = pendingCodePoint;
                    pendingCodePoint = '-';
                    ECConsume();
                }
                else
                {
                    pendingRangeStart = pendingCodePoint;
                    ECConsume();
                }
            }
            else
            {
                // Just a character, consume it
                codePointToSet = pendingCodePoint;
                pendingCodePoint = NextChar();
            }

            if (codePointToSet != INVALID_CODEPOINT || prevprevWasACharSetAndPartOfRange)
            {
                if (prevprevWasACharSetAndPartOfRange)
                {
                    //A range containing a character class and the unicode flag is present, thus we end up having to throw a "Syntax" error here
                    //This breaks the notion of Pass0 check for valid syntax, because during that time, the unicode flag is unknown.
                    if (unicodeFlagPresent)
                    {
                        Fail(JSERR_UnicodeRegExpRangeContainsCharClass);
                    }

                    if (pendingCodePoint != INVALID_CODEPOINT)
                    {
                        codePointSet.Set(ctAllocator, pendingCodePoint);
                    }

                    codePointSet.Set(ctAllocator, '-'); //Add '-' to set because a range was detected but turned out to be a union of character set with '-' and another atom.
                    pendingRangeStart = pendingCodePoint = INVALID_CODEPOINT;
                }
                else if (pendingRangeStart != INVALID_CODEPOINT)
                {
                    if (pendingRangeStart > pendingCodePoint)
                    {
                        //We have no unicodeFlag, but current range contains surrogates, thus we may end up having to throw a "Syntax" error here
                        //This breaks the notion of Pass0 check for valid syntax, because we don't know if we have a unicode option
                        Assert(!unicodeFlagPresent);
                        Fail(JSERR_RegExpBadRange);
                    }
                    
                    codePointSet.SetRange(ctAllocator, pendingRangeStart, pendingCodePoint);
                    pendingRangeStart = pendingCodePoint = INVALID_CODEPOINT;
                }
                else
                {
                    codePointSet.Set(ctAllocator, codePointToSet);
                }
            }

            nextChar = ECLookahead();
            prevprevWasACharSetAndPartOfRange = prevWasACharSetAndPartOfRange;
            prevWasACharSetAndPartOfRange = currIsACharSet && nextChar == '-';
            currIsACharSet = false;
        }

        if (pendingCodePoint != INVALID_CODEPOINT)
        {
            codePointSet.Set(ctAllocator, pendingCodePoint);
        }

        // At this point, we have a complete set of codepoints representing the range.
        // Before performing translation of any kind, we need to do some case filling.
        // At the point of this comment, there are no case mappings going cross-plane between simple
        // characters (< 0x10000) and supplementary characters (>= 0x10000)
        // However, it might still be the case, and this has to be handled.

        // On the other hand, we don't want to prevent optimizations that expect non-casefolded sets from happening.
        // At least for simple characters.

        // The simple case, is when the unicode flag isn't specified, we can go ahead and return the simple set.
        // Negations and case mappings will be handled later.
        if (!unicodeFlagPresent)
        {
            Assert(codePointSet.SimpleCharCount() == codePointSet.Count());
            MatchSetNode *simpleToReturn = Anew(ctAllocator, MatchSetNode, isNegation);
            codePointSet.CloneSimpleCharsTo(ctAllocator, simpleToReturn->set);
            return simpleToReturn;
        }

        // Everything past here must be under the flag
        Assert(scriptContext->GetConfig()->IsES6UnicodeExtensionsEnabled());

        if (codePointSet.IsEmpty())
        {
            return Anew(ctAllocator, MatchSetNode, false, false);
        }

        Node* prefixNode = nullptr;
        Node* suffixNode = nullptr;

        CharSet<codepoint_t> *toUseForTranslation = &codePointSet;

        // If a singleton, return a simple character
        bool isSingleton = !this->caseInsensitiveFlagPresent && !isNegation && codePointSet.IsSingleton();
        if (isSingleton)
        {
            codepoint_t singleton = codePointSet.Singleton();
            Node* toReturn = nullptr;

            if (singleton < 0x10000)
            {
                toReturn = Anew(ctAllocator, MatchCharNode, (char16)singleton);
            }
            else
            {
                Assert(unicodeFlagPresent);
                char16 lowerSurrogate, upperSurrogate;
                Js::NumberUtilities::CodePointAsSurrogatePair(singleton, &lowerSurrogate, &upperSurrogate);
                toReturn = CreateSurrogatePairAtom(lowerSurrogate, upperSurrogate);
            }

            codePointSet.Clear(ctAllocator);
            return toReturn;
        }

        // If negation, we want to complement the simple chars.
        // When a set is negated, optimizations skip checking if applicable, so we can go ahead and negate it here.
        CharSet<codepoint_t> negatedSet;

        if (!this->caseInsensitiveFlagPresent)
        {
            if (isNegation)
            {
                // Complement all characters, and use it as the set toTranslate
                codePointSet.ToComplement(ctAllocator, negatedSet);
            }

            toUseForTranslation = isNegation ? &negatedSet : &codePointSet;

            if (isNegation)
            {
                // Clear this, as we will no longer need this.
                codePointSet.FreeBody(ctAllocator);
            }
        }
        else
        {
            CharSet<codepoint_t> caseEquivalent;
            codePointSet.ToEquivClass(ctAllocator, caseEquivalent);
            // Equiv set can't have a reduced count of chars
            Assert(caseEquivalent.Count() >= codePointSet.Count());

            // Here we have a regex that has both case insensitive and unicode options.
            // The range might also be negated. If it is negated, we can go ahead and negate
            // the entire set as well as fill in cases, as optimizations wouldn't kick in anyways.
            if (isNegation)
            {
                codePointSet.Clear(ctAllocator);
                caseEquivalent.ToComplement(ctAllocator, codePointSet);
                caseEquivalent.FreeBody(ctAllocator);
            }
            else
            {
                codePointSet.CloneFrom(ctAllocator, caseEquivalent);
            }

            Assert(toUseForTranslation == &codePointSet);
        }

        uint totalCodePointsCount = toUseForTranslation->Count();
        uint simpleCharsCount = toUseForTranslation->SimpleCharCount();
        if (totalCodePointsCount == simpleCharsCount)
        {
            MatchSetNode *simpleToReturn = Anew(ctAllocator, MatchSetNode, isNegation);
            toUseForTranslation->CloneSimpleCharsTo(ctAllocator, simpleToReturn->set);
            return simpleToReturn;
        }

        if  (simpleCharsCount > 0)
        {
            if (!toUseForTranslation->ContainSurrogateCodeUnits())
            {
                MatchSetNode *node = Anew(ctAllocator, MatchSetNode, false, false);
                toUseForTranslation->CloneSimpleCharsTo(ctAllocator, node->set);
                prefixNode = node;
            }
            else
            {
                MatchSetNode *node = Anew(ctAllocator, MatchSetNode, false, false);
                toUseForTranslation->CloneNonSurrogateCodeUnitsTo(ctAllocator, node->set);
                prefixNode = node;
                node = Anew(ctAllocator, MatchSetNode, false, false);
                toUseForTranslation->CloneSurrogateCodeUnitsTo(ctAllocator, node->set);
                suffixNode = node;
            }
        }

        Assert(unicodeFlagPresent);
        AltNode *headToReturn = prefixNode == nullptr ? nullptr : Anew(ctAllocator, AltNode, prefixNode, nullptr);
        AltNode *currentTail = headToReturn;

        codepoint_t charRangeSearchIndex = 0x10000, lowerCharOfRange = 0, upperCharOfRange = 0;

        while (toUseForTranslation->GetNextRange(charRangeSearchIndex, &lowerCharOfRange, &upperCharOfRange))
        {
            if (lowerCharOfRange == upperCharOfRange)
            {
                currentTail = this->AppendSurrogatePairToDisjunction(lowerCharOfRange, currentTail);
            }
            else
            {
                currentTail = this->AppendSurrogateRangeToDisjunction(lowerCharOfRange, upperCharOfRange, currentTail);
            }

            if (headToReturn == nullptr)
            {
                headToReturn = currentTail;
            }

            AnalysisAssert(currentTail != nullptr);
            while (currentTail->tail != nullptr)
            {
                currentTail = currentTail->tail;
            }
            charRangeSearchIndex = upperCharOfRange + 1;
        }

        if (suffixNode != nullptr)
        {
            currentTail->tail = Anew(ctAllocator, AltNode, suffixNode, nullptr);
        }
        toUseForTranslation->Clear(ctAllocator);

        if (headToReturn != nullptr && headToReturn->tail == nullptr)
        {
            return headToReturn->head;
        }
        return headToReturn;
    }